

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O0

void __thiscall
slang::ast::InsideExpression::serializeTo(InsideExpression *this,ASTSerializer *serializer)

{
  string_view name;
  bool bVar1;
  Expression *__n;
  ASTSerializer *in_RSI;
  InsideExpression *in_RDI;
  Expression *elem;
  iterator __end3;
  iterator __begin3;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *__range3;
  ASTSerializer *expr;
  ASTSerializer *in_stack_ffffffffffffff90;
  size_t in_stack_ffffffffffffff98;
  __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
  in_stack_ffffffffffffffa0;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> local_58;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *local_48;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> local_30;
  int local_20;
  void *local_18;
  ASTSerializer *local_10;
  
  local_10 = in_RSI;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff90,
             (char *)in_RDI);
  __n = left(in_RDI);
  ASTSerializer::write(in_RSI,local_20,local_18,(size_t)__n);
  local_30 = rangeList(in_RDI);
  bVar1 = std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::empty
                    ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)0x9bbf3b);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff90,
               (char *)in_RDI);
    name._M_str = (char *)in_stack_ffffffffffffffa0._M_current;
    name._M_len = in_stack_ffffffffffffff98;
    ASTSerializer::startArray(in_stack_ffffffffffffff90,name);
    local_58 = rangeList(in_RDI);
    local_48 = &local_58;
    std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::begin
              ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)local_10);
    std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::end
              ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)in_RDI);
    expr = local_10;
    while (bVar1 = __gnu_cxx::
                   operator==<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                             ((__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                               *)in_RSI,
                              (__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                               *)expr), ((bVar1 ^ 0xffU) & 1) != 0) {
      __gnu_cxx::
      __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
      ::operator*((__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                   *)&stack0xffffffffffffffa0);
      ASTSerializer::serialize(in_RSI,(Expression *)expr);
      __gnu_cxx::
      __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
      ::operator++((__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                    *)&stack0xffffffffffffffa0);
    }
    ASTSerializer::endArray((ASTSerializer *)0x9bbffd);
  }
  return;
}

Assistant:

void InsideExpression::serializeTo(ASTSerializer& serializer) const {
    serializer.write("left", left());

    if (!rangeList().empty()) {
        serializer.startArray("rangeList");
        for (auto elem : rangeList())
            serializer.serialize(*elem);
        serializer.endArray();
    }
}